

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

MP<8UL,_GF2::MOGrevlex<8UL>_> * __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
          (MP<8UL,_GF2::MOGrevlex<8UL>_> *this,size_t i,MP<8UL,_GF2::MOGrevlex<8UL>_> *poly)

{
  bool bVar1;
  const_iterator __x;
  const_iterator this_00;
  WW<8UL> *this_01;
  size_t in_RSI;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_RDI;
  const_iterator iter;
  MM<8UL> m;
  list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *in_stack_ffffffffffffffe0;
  
  MM<8UL>::MM((MM<8UL> *)0x1d52c6);
  SetEmpty((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1d52cf);
  __x = std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::begin
                  (&in_RDI->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>);
  while( true ) {
    this_00 = std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end
                        (&in_RDI->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,(_Self *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MM<8UL>_>::operator*
              ((_List_const_iterator<GF2::MM<8UL>_> *)0x1d530c);
    this_01 = &MM<8UL>::operator=((MM<8UL> *)this_00._M_node,(MM<8UL> *)in_RDI)->super_WW<8UL>;
    WW<8UL>::Set(this_01,in_RSI,true);
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::push_back
              (in_stack_ffffffffffffffe0,(value_type *)__x._M_node);
    std::_List_const_iterator<GF2::MM<8UL>_>::operator++
              ((_List_const_iterator<GF2::MM<8UL>_> *)&stack0xffffffffffffffd8);
  }
  Normalize(this);
  return in_RDI;
}

Assistant:

MP& SPoly(size_t i, const MP& poly)
	{
		// предусловия
		assert(this != &poly && IsConsistent(poly));
		// сбор мономов
		MM<_n> m;
		SetEmpty();
		for (const_iterator iter = poly.begin(); iter != poly.end(); ++iter)
			(m = *iter).Set(i, 1), push_back(m);
		// нормализация
		Normalize();
		return *this;
	}